

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QtPrivate::QCalendarTextNavigator::createDateLabel(QCalendarTextNavigator *this)

{
  QFrame *this_00;
  QLayout *l;
  QWidget *widget;
  QCalendarDateValidator *pQVar1;
  long in_FS_OFFSET;
  QLocale QStack_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_dateFrame == (QFrame *)0x0) {
    this_00 = (QFrame *)operator_new(0x28);
    QFrame::QFrame(this_00,this->m_widget,(WindowFlags)0x0);
    this->m_dateFrame = this_00;
    l = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)l);
    widget = (QWidget *)operator_new(0x28);
    QLabel::QLabel((QLabel *)widget,(QWidget *)0x0,(WindowFlags)0x0);
    this->m_dateText = (QLabel *)widget;
    QBoxLayout::addWidget((QBoxLayout *)l,widget,0,(Alignment)0x0);
    QWidget::setLayout(&this->m_dateFrame->super_QWidget,l);
    QFrame::setFrameShadow(this->m_dateFrame,Plain);
    QFrame::setFrameShape(this->m_dateFrame,Box);
    pQVar1 = (QCalendarDateValidator *)operator_new(0xb0);
    QCalendarDateValidator::QCalendarDateValidator(pQVar1);
    this->m_dateValidator = pQVar1;
    QWidget::locale((QLocale *)&local_40,this->m_widget);
    QCalendarDateValidator::setLocale(pQVar1,(QLocale *)&local_40);
    QLocale::~QLocale((QLocale *)&local_40);
    pQVar1 = this->m_dateValidator;
    QWidget::locale(&QStack_48,this->m_widget);
    QLocale::dateFormat((FormatType)&local_40);
    QCalendarDateValidator::setFormat(pQVar1,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    QLocale::~QLocale(&QStack_48);
    QCalendarDateValidator::setInitialDate
              (this->m_dateValidator,(this->m_date).jd,*(undefined8 *)&this->m_calendar);
    QWidget::setAutoFillBackground(&this->m_dateFrame->super_QWidget,true);
    QWidget::setBackgroundRole(&this->m_dateFrame->super_QWidget,Window);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarTextNavigator::createDateLabel()
{
    if (m_dateFrame)
        return;
    m_dateFrame = new QFrame(m_widget);
    QVBoxLayout *vl = new QVBoxLayout;
    m_dateText = new QLabel;
    vl->addWidget(m_dateText);
    m_dateFrame->setLayout(vl);
    m_dateFrame->setFrameShadow(QFrame::Plain);
    m_dateFrame->setFrameShape(QFrame::Box);
    m_dateValidator = new QCalendarDateValidator();
    m_dateValidator->setLocale(m_widget->locale());
    m_dateValidator->setFormat(m_widget->locale().dateFormat(QLocale::ShortFormat));
    m_dateValidator->setInitialDate(m_date, m_calendar);

    m_dateFrame->setAutoFillBackground(true);
    m_dateFrame->setBackgroundRole(QPalette::Window);
}